

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O1

token_t __thiscall grammar::add_nonterminal(grammar *this,symbol_t *symbol,token_t nonterm)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  token_t tVar4;
  _Base_ptr p_Var5;
  mapped_type *lhs;
  _Base_ptr p_Var6;
  _Rb_tree_color unaff_EBP;
  map<strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
  *__range1;
  key_type local_34;
  
  p_Var1 = &(this->symbols)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0;
      p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < nonterm.internal_rep]) {
    if (nonterm.internal_rep <= (int)p_Var6[1]._M_color) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (p_Var6 = p_Var5, nonterm.internal_rep < (int)p_Var5[1]._M_color)) {
    p_Var6 = &p_Var1->_M_header;
  }
  local_34.internal_rep = nonterm.internal_rep;
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    std::
    _Rb_tree<strong_t<int,grammar::token_tag>,std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>,std::_Select1st<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>>
    ::
    _M_emplace_unique<strong_t<int,grammar::token_tag>&,strong_t<std::__cxx11::string,grammar::symbol_tag>const&>
              ((_Rb_tree<strong_t<int,grammar::token_tag>,std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>,std::_Select1st<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>>
                *)this,&local_34,symbol);
    tVar4.internal_rep = local_34.internal_rep;
  }
  else {
    lhs = std::
          map<strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
          ::at(&this->symbols,&local_34);
    bVar2 = operator==(lhs,symbol);
    tVar4.internal_rep = local_34.internal_rep;
    if (!bVar2) {
      p_Var6 = (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar2 = (_Rb_tree_header *)p_Var6 == p_Var1;
      if (!bVar2) {
        bVar3 = operator==((this_t *)&p_Var6[1]._M_parent,symbol);
        unaff_EBP = p_Var6[1]._M_color;
        bVar3 = !bVar3;
        while (bVar3) {
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
          bVar2 = (_Rb_tree_header *)p_Var6 == p_Var1;
          if (bVar2) break;
          bVar3 = operator==((this_t *)&p_Var6[1]._M_parent,symbol);
          bVar3 = !bVar3;
          if (!bVar3) {
            unaff_EBP = p_Var6[1]._M_color;
          }
        }
      }
      tVar4.internal_rep = unaff_EBP;
      if (bVar2) {
        tVar4 = get_nonterminal(this,symbol);
      }
    }
  }
  return (token_t)tVar4.internal_rep;
}

Assistant:

token_t grammar::add_nonterminal(const symbol_t & symbol, token_t nonterm) {
    if (symbols.count(nonterm) == 0) {
        symbols.emplace(nonterm, symbol);
        return nonterm;
    } else if (symbols.at(nonterm) == symbol)
        return nonterm;

    for (auto & entry : symbols)
        if (entry.second == symbol) return entry.first;

    return this->get_nonterminal(symbol);
}